

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O2

FString __thiscall input_mod::GetStats(input_mod *this)

{
  int iVar1;
  byte *pbVar2;
  DUMB_IT_SIGRENDERER *pDVar3;
  DUMB_IT_SIGDATA *pDVar4;
  long lVar5;
  long in_RSI;
  ulong uVar6;
  ulong uVar7;
  
  pDVar3 = duh_get_it_sigrenderer(*(DUH_SIGRENDERER **)(in_RSI + 0x78));
  pDVar4 = duh_get_it_sigdata(*(DUH **)(in_RSI + 0x70));
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  (this->super_StreamSong).super_MusInfo._vptr_MusInfo = (_func_int **)0x71deec;
  uVar7 = 0;
  for (lVar5 = 0xa8; lVar5 != 0x28a8; lVar5 = lVar5 + 0xa0) {
    pbVar2 = *(byte **)(pDVar3->channel[0].arpeggio_offsets + lVar5 + -0x50);
    if (pbVar2 != (byte *)0x0) {
      uVar7 = (ulong)((int)uVar7 + (uint)((*pbVar2 & 8) == 0));
    }
  }
  for (lVar5 = 0x504; lVar5 != 0x5c4; lVar5 = lVar5 + 1) {
    uVar7 = (ulong)(((int)uVar7 + 1) -
                   (uint)(*(long *)(pDVar3->channel[0].arpeggio_offsets + lVar5 * 8 + -0x50) == 0));
  }
  if (pDVar4 == (DUMB_IT_SIGDATA *)0x0 || pDVar3 == (DUMB_IT_SIGRENDERER *)0x0) {
    FString::operator=((FString *)this,"Problem getting stats");
  }
  else {
    iVar1 = pDVar3->order;
    uVar6 = 0;
    if ((pDVar4->order != (uchar *)0x0) && (iVar1 < pDVar4->n_orders)) {
      uVar6 = (ulong)pDVar4->order[iVar1];
    }
    FString::Format((FString *)this,
                    "%s, Order:%3d/%d Patt:%2d/%d Row:%2d/%2d Chan:%2d/%2d Speed:%2d Tempo:%3d",
                    *(undefined8 *)(in_RSI + 0x18),(long)iVar1,(ulong)*(uint *)(in_RSI + 0x38),uVar6
                    ,(ulong)*(uint *)(in_RSI + 0x34),(ulong)(uint)pDVar3->row,
                    (ulong)(uint)pDVar3->n_rows,uVar7,(ulong)*(uint *)(in_RSI + 0x30),
                    (ulong)(uint)pDVar3->speed,(ulong)(uint)pDVar3->tempo);
  }
  return (FString)(char *)this;
}

Assistant:

FString input_mod::GetStats()
{
	//return StreamSong::GetStats();
	DUMB_IT_SIGRENDERER *itsr = duh_get_it_sigrenderer(sr);
	DUMB_IT_SIGDATA *itsd = duh_get_it_sigdata(duh);
	FString out;

	int channels = 0;
	for (int i = 0; i < DUMB_IT_N_CHANNELS; i++)
	{
		IT_PLAYING * playing = itsr->channel[i].playing;
		if (playing && !(playing->flags & IT_PLAYING_DEAD)) channels++;
	}
	for (int i = 0; i < DUMB_IT_N_NNA_CHANNELS; i++)
	{
		if (itsr->playing[i]) channels++;
	}

	if (itsr == NULL || itsd == NULL)
	{
		out = "Problem getting stats";
	}
	else
	{
		out.Format("%s, Order:%3d/%d Patt:%2d/%d Row:%2d/%2d Chan:%2d/%2d Speed:%2d Tempo:%3d",
			Codec.GetChars(),
			itsr->order, NumOrders,
			(itsd->order && itsr->order < itsd->n_orders ? itsd->order[itsr->order] : 0), NumPatterns,
			itsr->row, itsr->n_rows,
			channels, NumChannels,
			itsr->speed,
			itsr->tempo
			);
	}
	return out;
}